

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O3

void Imf_3_4::
     GetChannelsInMultiPartFile<std::vector<Imf_3_4::MultiViewChannelName,std::allocator<Imf_3_4::MultiViewChannelName>>>
               (MultiPartInputFile *file,
               vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>
               *chans)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Header *pHVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  undefined8 uVar7;
  ConstIterator tmp;
  string view;
  MultiViewChannelName m;
  StringVector mview;
  allocator<char> local_111;
  MultiPartInputFile *local_110;
  undefined8 local_108;
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  undefined1 local_c0 [32];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  int local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_> *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110 = file;
  local_38 = chans;
  iVar2 = Imf_3_4::MultiPartInputFile::parts();
  uVar7 = 0;
  local_108 = 0;
  if (iVar2 == 1) {
    pHVar4 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_110);
    cVar1 = Imf_3_4::hasMultiView(pHVar4);
    if (cVar1 == '\0') {
      local_108 = 0;
    }
    else {
      pHVar4 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_110);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)Imf_3_4::multiView_abi_cxx11_(pHVar4);
      local_108 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_58,__x);
    }
  }
  iVar2 = 0;
  while( true ) {
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar3 <= iVar2) break;
    Imf_3_4::MultiPartInputFile::header((int)local_110);
    Imf_3_4::Header::channels();
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
    Imf_3_4::MultiPartInputFile::header((int)local_110);
    cVar1 = Imf_3_4::Header::hasView();
    if (cVar1 != '\0') {
      Imf_3_4::MultiPartInputFile::header((int)local_110);
      Imf_3_4::Header::view_abi_cxx11_();
      std::__cxx11::string::_M_assign((string *)local_100);
    }
    p_Var5 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
    while( true ) {
      p_Var6 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
      if (p_Var5 == p_Var6) break;
      local_c0._0_8_ = local_c0 + 0x10;
      local_c0._8_8_ = 0;
      local_c0[0x10] = '\0';
      local_a0._M_p = (pointer)&local_90;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_78._M_p = (pointer)&local_68;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,(char *)(p_Var5 + 1),&local_111);
      std::__cxx11::string::operator=((string *)local_c0,(string *)local_e0);
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0],local_d0[0] + 1);
      }
      std::__cxx11::string::_M_assign((string *)&local_78);
      if ((char)local_108 == '\0') {
        std::__cxx11::string::_M_assign((string *)&local_a0);
      }
      else {
        Imf_3_4::viewFromChannelName((string *)local_e0,(vector *)local_c0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)local_e0);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        Imf_3_4::removeViewName((string *)local_e0,(string *)&local_78);
        std::__cxx11::string::operator=((string *)local_c0,(string *)local_e0);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
      }
      local_80 = iVar2;
      std::vector<Imf_3_4::MultiViewChannelName,_std::allocator<Imf_3_4::MultiViewChannelName>_>::
      push_back(local_38,(value_type *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,
                        CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_p != &local_90) {
        operator_delete(local_a0._M_p,
                        CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1)
        ;
      }
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    iVar2 = iVar2 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

inline void
GetChannelsInMultiPartFile (const MultiPartInputFile& file, T& chans)
{
    bool         has_multiview = false;
    StringVector mview;
    if (file.parts () == 1)
    {
        if (hasMultiView (file.header (0)))
        {
            mview         = multiView (file.header (0));
            has_multiview = true;
        }
    }

    for (int p = 0; p < file.parts (); p++)
    {
        const ChannelList& c = file.header (p).channels ();

        std::string view = "";
        if (file.header (p).hasView ()) { view = file.header (p).view (); }
        for (ChannelList::ConstIterator i = c.begin (); i != c.end (); i++)
        {
            MultiViewChannelName m;
            m.name          = std::string (i.name ());
            m.internal_name = m.name;

            if (has_multiview)
            {
                m.view = viewFromChannelName (m.name, mview);
                m.name = removeViewName (m.internal_name, m.view);
            }
            else { m.view = view; }
            m.part_number = p;
            chans.push_back (m);
        }
    }
}